

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiWindowSettings * ImGui::CreateNewWindowSettings(char *name)

{
  ImU32 IVar1;
  ImGuiWindowSettings *pIVar2;
  char *pcVar3;
  ImVector<ImGuiWindowSettings> *this;
  ImGuiWindowSettings local_28;
  
  this = &GImGui->SettingsWindows;
  local_28.Name = (char *)0x0;
  local_28._8_5_ = 0;
  local_28.Pos._1_3_ = 0;
  local_28.Size.x = 0;
  local_28.Size.y = 0;
  local_28.Collapsed = false;
  ImVector<ImGuiWindowSettings>::push_back(this,&local_28);
  pIVar2 = ImVector<ImGuiWindowSettings>::back(this);
  pcVar3 = strstr(name,"###");
  if (pcVar3 != (char *)0x0) {
    name = pcVar3;
  }
  pcVar3 = ImStrdup(name);
  pIVar2->Name = pcVar3;
  IVar1 = ImHashStr(name,0,0);
  pIVar2->ID = IVar1;
  return pIVar2;
}

Assistant:

ImGuiWindowSettings* ImGui::CreateNewWindowSettings(const char* name)
{
    ImGuiContext& g = *GImGui;
    g.SettingsWindows.push_back(ImGuiWindowSettings());
    ImGuiWindowSettings* settings = &g.SettingsWindows.back();
#if !IMGUI_DEBUG_INI_SETTINGS
    // Skip to the "###" marker if any. We don't skip past to match the behavior of GetID()
    // Preserve the full string when IMGUI_DEBUG_INI_SETTINGS is set to make .ini inspection easier.
    if (const char* p = strstr(name, "###"))
        name = p;
#endif
    settings->Name = ImStrdup(name);
    settings->ID = ImHashStr(name);
    return settings;
}